

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::sl::ShaderCase::iterate(ShaderCase *this)

{
  bool executeOk;
  ShaderCase *this_local;
  
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  execute(this);
  return STOP;
}

Assistant:

TestCase::IterateResult ShaderCase::iterate(void)
{
	// Initialize state to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	bool executeOk = execute();

	DE_ASSERT(executeOk ? m_testCtx.getTestResult() == QP_TEST_RESULT_PASS :
						  m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
	(void)executeOk;
	return TestCase::STOP;
}